

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2dense.c
# Opt level: O3

void mod2dense_copy(mod2dense *m,mod2dense *r)

{
  uint uVar1;
  mod2word *pmVar2;
  mod2word *pmVar3;
  mod2word **ppmVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  int in_ECX;
  ulong uVar8;
  uint extraout_EDX;
  int extraout_EDX_00;
  long extraout_RDX;
  long extraout_RDX_00;
  int iVar9;
  FILE *m_00;
  uint uVar10;
  long lVar11;
  FILE *__stream;
  
  if (m->n_rows <= r->n_rows) {
    in_ECX = r->n_cols;
    if (m->n_cols <= in_ECX) {
      if (m->n_cols < 1) {
        uVar7 = 0;
      }
      else {
        uVar7 = 0;
        do {
          uVar8 = 0;
          if (0 < m->n_words) {
            pmVar2 = m->col[uVar7];
            pmVar3 = r->col[uVar7];
            uVar8 = 0;
            do {
              pmVar3[uVar8] = pmVar2[uVar8];
              uVar8 = uVar8 + 1;
            } while ((long)uVar8 < (long)m->n_words);
          }
          if ((int)uVar8 < r->n_words) {
            pmVar2 = r->col[uVar7];
            uVar8 = uVar8 & 0xffffffff;
            do {
              pmVar2[uVar8] = 0;
              uVar8 = uVar8 + 1;
            } while ((int)uVar8 < r->n_words);
          }
          uVar7 = uVar7 + 1;
        } while ((long)uVar7 < (long)m->n_cols);
        in_ECX = r->n_cols;
      }
      if ((int)uVar7 < in_ECX) {
        uVar7 = uVar7 & 0xffffffff;
        uVar8 = (ulong)(uint)r->n_words;
        do {
          if (0 < (int)uVar8) {
            pmVar2 = r->col[uVar7];
            lVar11 = 0;
            do {
              pmVar2[lVar11] = 0;
              lVar11 = lVar11 + 1;
              uVar8 = (ulong)r->n_words;
            } while (lVar11 < (long)uVar8);
            in_ECX = r->n_cols;
          }
          uVar7 = uVar7 + 1;
        } while ((int)uVar7 < in_ECX);
      }
      return;
    }
  }
  mod2dense_copy_cold_1();
  m_00 = (FILE *)r;
  __stream = (FILE *)m;
  if (*(int *)&((FILE *)m)->field_0x4 <= *(int *)&((FILE *)r)->field_0x4) {
    __stream = (FILE *)r;
    mod2dense_clear(r);
    iVar9 = ((FILE *)r)->_flags;
    if (0 < iVar9) {
      uVar7 = 0;
      do {
        in_ECX = *(int *)(extraout_RDX + uVar7 * 4);
        if ((in_ECX < 0) || (((FILE *)m)->_flags <= in_ECX)) {
          mod2dense_copyrows_cold_1();
          goto LAB_00122cbb;
        }
        if (0 < *(int *)&((FILE *)m)->field_0x4) {
          iVar9 = 0;
          do {
            iVar5 = mod2dense_get(m,*(int *)(extraout_RDX + uVar7 * 4),iVar9);
            m_00 = (FILE *)(uVar7 & 0xffffffff);
            __stream = (FILE *)r;
            mod2dense_set(r,(int)uVar7,iVar9,iVar5);
            iVar9 = iVar9 + 1;
          } while (iVar9 < *(int *)&((FILE *)m)->field_0x4);
          iVar9 = ((FILE *)r)->_flags;
        }
        uVar7 = uVar7 + 1;
      } while ((long)uVar7 < (long)iVar9);
    }
    return;
  }
LAB_00122cbb:
  mod2dense_copyrows_cold_2();
  uVar6 = (uint)m_00;
  if ((((-1 < (int)uVar6) && (-1 < (int)extraout_EDX)) && ((int)uVar6 < __stream->_flags)) &&
     ((int)extraout_EDX < *(int *)&__stream->field_0x4)) {
    uVar7 = (ulong)m_00 >> 5 & 0x7ffffff;
    uVar1 = (*(mod2word **)((long)__stream->_IO_read_end + (ulong)extraout_EDX * 8))[uVar7];
    uVar10 = uVar1 & ~(1 << (uVar6 & 0x1f));
    if (in_ECX != 0) {
      uVar10 = uVar1 | 1 << (uVar6 & 0x1f);
    }
    (*(mod2word **)((long)__stream->_IO_read_end + (ulong)extraout_EDX * 8))[uVar7] = uVar10;
    return;
  }
  mod2dense_set_cold_1();
  if (((-1 < (int)m_00) && (-1 < extraout_EDX_00)) &&
     (((int)m_00 < __stream->_flags && (extraout_EDX_00 < *(int *)&__stream->field_0x4)))) {
    return;
  }
  mod2dense_get_cold_1();
  if (m_00->_flags < __stream->_flags) {
LAB_00122db0:
    mod2dense_copycols_cold_2();
    if (0 < m_00->_flags) {
      iVar9 = 0;
      do {
        if (0 < *(int *)&m_00->field_0x4) {
          iVar5 = 0;
          do {
            uVar6 = mod2dense_get((mod2dense *)m_00,iVar9,iVar5);
            fprintf(__stream," %d",(ulong)uVar6);
            iVar5 = iVar5 + 1;
          } while (iVar5 < *(int *)&m_00->field_0x4);
        }
        fputc(10,__stream);
        iVar9 = iVar9 + 1;
      } while (iVar9 < m_00->_flags);
    }
    return;
  }
  if (0 < *(int *)&m_00->field_0x4) {
    lVar11 = 0;
    do {
      iVar9 = *(int *)(extraout_RDX_00 + lVar11 * 4);
      if ((iVar9 < 0) || (*(int *)&__stream->field_0x4 <= iVar9)) {
        mod2dense_copycols_cold_1();
        goto LAB_00122db0;
      }
      if (*(int *)&__stream->_IO_read_ptr < 1) {
        uVar7 = 0;
      }
      else {
        ppmVar4 = (mod2word **)__stream->_IO_read_end;
        pmVar2 = *(mod2word **)((long)m_00->_IO_read_end + lVar11 * 8);
        uVar7 = 0;
        do {
          pmVar2[uVar7] = ppmVar4[*(int *)(extraout_RDX_00 + lVar11 * 4)][uVar7];
          uVar7 = uVar7 + 1;
        } while ((long)uVar7 < (long)*(int *)&__stream->_IO_read_ptr);
      }
      if ((int)uVar7 < *(int *)&m_00->_IO_read_ptr) {
        pmVar2 = *(mod2word **)((long)m_00->_IO_read_end + lVar11 * 8);
        uVar7 = uVar7 & 0xffffffff;
        do {
          pmVar2[uVar7] = 0;
          uVar7 = uVar7 + 1;
        } while ((int)uVar7 < *(int *)&m_00->_IO_read_ptr);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < *(int *)&m_00->field_0x4);
  }
  return;
}

Assistant:

void mod2dense_copy
( mod2dense *m,		/* Matrix to copy */
  mod2dense *r		/* Place to store copy of matrix */
)
{ 
  int k, j;

  if (mod2dense_rows(m)>mod2dense_rows(r) 
   || mod2dense_cols(m)>mod2dense_cols(r))
  { fprintf(stderr,"mod2dense_copy: Destination matrix is too small\n");
    exit(1);
  }

  for (j = 0; j<mod2dense_cols(m); j++)
  { for (k = 0; k<m->n_words; k++)
    { r->col[j][k] = m->col[j][k];
    }
    for ( ; k<r->n_words; k++)
    { r->col[j][k] = 0;
    }
  }

  for ( ; j<mod2dense_cols(r); j++)
  { for (k = 0; k<r->n_words; k++)
    { r->col[j][k] = 0;
    }
  }
}